

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

void __thiscall helics::BrokerBase::baseConfigure(BrokerBase *this,ActionMessage *command)

{
  if (command->messageAction == cmd_base_configure) {
    if (command->messageID == 0x58) {
      LOCK();
      (((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->forceLoggingFlush)._M_base._M_i = (__int_type)((byte)command->flags >> 5 & 1);
      UNLOCK();
      return;
    }
    if (command->messageID == 0x59) {
      this->dumplog = (bool)((byte)command->flags >> 5 & 1);
    }
  }
  return;
}

Assistant:

void BrokerBase::baseConfigure(ActionMessage& command)
{
    if (command.action() == CMD_BASE_CONFIGURE) {
        switch (command.messageID) {
            case HELICS_FLAG_DUMPLOG:
                dumplog = checkActionFlag(command, indicator_flag);
                break;
            case HELICS_FLAG_FORCE_LOGGING_FLUSH:
                mLogManager->forceLoggingFlush = checkActionFlag(command, indicator_flag);
                break;
            default:
                break;
        }
    }
}